

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O2

void __thiscall HighsMipSolverData::runSetup(HighsMipSolverData *this)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  vector<double,_std::allocator<double>_> *Avalue;
  HighsDomain *globaldom;
  Highs *this_00;
  double *pdVar2;
  double dVar3;
  int iVar4;
  HighsInt HVar5;
  HighsOptions *pHVar6;
  pointer piVar7;
  HighsLp *pHVar8;
  pointer piVar9;
  pointer pdVar10;
  HighsInt *pHVar11;
  pointer piVar12;
  pointer piVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  double dVar17;
  bool bVar18;
  int iVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  logic_error *this_01;
  char *pcVar23;
  int *piVar24;
  HighsInt j;
  HighsMipSolver *pHVar25;
  long lVar26;
  HighsInt *pHVar27;
  uint uVar28;
  int *piVar29;
  vector<int,_std::allocator<int>_> *this_02;
  int *piVar30;
  HighsInt j_1;
  undefined4 uVar31;
  undefined4 uVar32;
  char *pcVar33;
  reference rVar34;
  allocator local_239;
  char *local_238;
  undefined8 uStack_230;
  HighsLp *local_228;
  double local_220;
  double local_218;
  undefined8 uStack_210;
  vector<int,_std::allocator<int>_> *local_200;
  vector<int,_std::allocator<int>_> *local_1f8;
  vector<int,_std::allocator<int>_> *local_1f0;
  vector<int,_std::allocator<int>_> *local_1e8;
  vector<double,_std::allocator<double>_> *local_1e0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_1d8;
  HighsMipSolverData *local_1d0;
  ulong local_1c8;
  ulong local_1c0;
  string local_1b8;
  undefined1 local_198 [32];
  pointer local_178;
  pointer pmStack_170;
  
  pHVar25 = this->mipsolver;
  local_228 = pHVar25->model_;
  *(undefined4 *)&this->disptime = 0;
  *(undefined4 *)((long)&this->disptime + 4) = 0;
  *(undefined4 *)&this->last_disptime = 0;
  *(undefined4 *)((long)&this->last_disptime + 4) = 0xfff00000;
  dVar3 = local_228->offset_;
  dVar16 = this->upper_limit - dVar3;
  dVar17 = this->optimality_limit - dVar3;
  auVar14._8_4_ = SUB84(dVar17,0);
  auVar14._0_8_ = dVar16;
  auVar14._12_4_ = (int)((ulong)dVar17 >> 0x20);
  this->upper_limit = dVar16;
  this->optimality_limit = (double)auVar14._8_8_;
  dVar16 = this->lower_bound - dVar3;
  dVar3 = this->upper_bound - dVar3;
  auVar15._8_4_ = SUB84(dVar3,0);
  auVar15._0_8_ = dVar16;
  auVar15._12_4_ = (int)((ulong)dVar3 >> 0x20);
  this->lower_bound = dVar16;
  this->upper_bound = (double)auVar15._8_8_;
  if (pHVar25->solution_objective_ < INFINITY) {
    presolve::HighsPostsolveStack::getReducedPrimalSolution
              ((vector<double,_std::allocator<double>_> *)local_198,&this->postSolveStack,
               &pHVar25->solution_);
    std::vector<double,_std::allocator<double>_>::_M_move_assign(&this->incumbent);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)local_198);
    pHVar25 = this->mipsolver;
    dVar3 = (pHVar25->options_mip_->super_HighsOptionsStruct).mip_feasibility_tolerance;
    if ((dVar3 < pHVar25->bound_violation_) || (dVar3 < pHVar25->integrality_violation_)) {
      bVar18 = false;
    }
    else {
      bVar18 = pHVar25->row_violation_ <= dVar3;
    }
    pcVar33 = (char *)((double)pHVar25->orig_model_->sense_ * pHVar25->solution_objective_ -
                      pHVar25->model_->offset_);
    if (this->numRestarts == 0) {
      pcVar23 = "infeasible";
      if (bVar18) {
        pcVar23 = "feasible";
      }
      local_238 = pcVar33;
      highsLogUser(&(pHVar25->options_mip_->super_HighsOptionsStruct).log_options,kInfo,
                   "\nMIP start solution is %s, objective value is %.12g\n",pcVar23);
      pcVar33 = local_238;
    }
    if ((bVar18) && (dVar3 = this->upper_bound, (double)pcVar33 < dVar3)) {
      this->upper_bound = (double)pcVar33;
      local_238 = pcVar33;
      if (this->mipsolver->submip == false) {
        if (((double)pcVar33 != dVar3) || (NAN((double)pcVar33) || NAN(dVar3))) {
          updatePrimalDualIntegral
                    (this,this->lower_bound,this->lower_bound,dVar3,(double)pcVar33,false,false);
        }
      }
      local_218 = computeNewUpperLimit(this,(double)local_238,0.0,0.0);
      saveReportMipSolution(this,local_218);
      if (local_218 < this->upper_limit) {
        this->upper_limit = local_218;
        pHVar6 = this->mipsolver->options_mip_;
        dVar3 = computeNewUpperLimit
                          (this,(double)local_238,(pHVar6->super_HighsOptionsStruct).mip_abs_gap,
                           (pHVar6->super_HighsOptionsStruct).mip_rel_gap);
        this->optimality_limit = dVar3;
        (this->nodequeue).optimality_limit = dVar3;
      }
    }
    pHVar25 = this->mipsolver;
    if (((pHVar25->submip == false) && (bVar18)) &&
       ((pHVar25->callback_->user_callback).super__Function_base._M_manager != (_Manager_type)0x0))
    {
      rVar34 = std::vector<bool,_std::allocator<bool>_>::operator[](&pHVar25->callback_->active,3);
      pHVar25 = this->mipsolver;
      if ((*rVar34._M_p & rVar34._M_mask) != 0) {
        HighsCallback::clearHighsCallbackDataOut(pHVar25->callback_);
        pHVar25 = this->mipsolver;
        (pHVar25->callback_->data_out).mip_solution =
             (pHVar25->solution_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_238 = (char *)pHVar25->solution_objective_;
        std::__cxx11::string::string
                  ((string *)&local_1b8,"Feasible solution",(allocator *)local_198);
        interruptFromCallbackWithData(this,3,(double)local_238,&local_1b8);
        std::__cxx11::string::~string((string *)&local_1b8);
        pHVar25 = this->mipsolver;
      }
    }
  }
  if (pHVar25->model_->num_col_ == 0) {
    local_198._0_8_ = (pointer)0x0;
    local_198._8_8_ = (pointer)0x0;
    local_198._16_8_ = (pointer)0x0;
    addIncumbent(this,(vector<double,_std::allocator<double>_> *)local_198,0.0,5,true,false);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)local_198);
  }
  local_178 = (pointer)0x0;
  pmStack_170 = (pointer)0x0;
  local_198._16_8_ = (pointer)0x0;
  local_198._24_8_ = (pointer)0x0;
  local_198._0_8_ = (pointer)0x0;
  local_198._8_8_ = (pointer)0x0;
  HighsRedcostFixing::operator=(&this->redcostfixing,(HighsRedcostFixing *)local_198);
  HighsRedcostFixing::~HighsRedcostFixing((HighsRedcostFixing *)local_198);
  HighsPseudocost::HighsPseudocost((HighsPseudocost *)local_198,this->mipsolver);
  HighsPseudocost::operator=(&this->pseudocost,(HighsPseudocost *)local_198);
  HighsPseudocost::~HighsPseudocost((HighsPseudocost *)local_198);
  HighsNodeQueue::setNumCol(&this->nodequeue,this->mipsolver->model_->num_col_);
  (this->nodequeue).optimality_limit = this->optimality_limit;
  piVar7 = (this->continuous_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->continuous_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar7) {
    (this->continuous_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar7;
  }
  piVar7 = (this->integer_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->integer_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar7) {
    (this->integer_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar7;
  }
  piVar7 = (this->implint_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->implint_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar7) {
    (this->implint_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar7;
  }
  piVar7 = (this->integral_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->integral_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar7) {
    (this->integral_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar7;
  }
  local_1f8 = &this->continuous_cols;
  local_1e8 = &this->integer_cols;
  local_1f0 = &this->implint_cols;
  local_200 = &this->integral_cols;
  this->rowMatrixSet = true;
  pvVar1 = &(local_228->a_matrix_).start_;
  Avalue = &(local_228->a_matrix_).value_;
  highsSparseTranspose
            (local_228->num_row_,local_228->num_col_,pvVar1,&(local_228->a_matrix_).index_,Avalue,
             &this->ARstart_,&this->ARindex_,&this->ARvalue_);
  local_198._0_8_ = local_198._0_8_ & 0xffffffff00000000;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&this->uplocks,(long)local_228->num_col_,(value_type_conflict2 *)local_198);
  local_198._0_8_ = local_198._0_8_ & 0xffffffff00000000;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&this->downlocks,(long)local_228->num_col_,(value_type_conflict2 *)local_198);
  uVar21 = 0;
  while (uVar21 != (uint)local_228->num_col_) {
    piVar7 = (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    iVar19 = piVar7[uVar21 + 1];
    uVar22 = uVar21 + 1;
    piVar29 = (this->downlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start + uVar21;
    piVar24 = (this->uplocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start + uVar21;
    for (lVar26 = (long)piVar7[uVar21]; uVar21 = uVar22, iVar19 != lVar26; lVar26 = lVar26 + 1) {
      iVar4 = (local_228->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar26];
      if (-INFINITY <
          (local_228->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar4]) {
        pdVar2 = (Avalue->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start + lVar26;
        piVar30 = piVar29;
        if (*pdVar2 <= 0.0 && *pdVar2 != 0.0) {
          piVar30 = piVar24;
        }
        *piVar30 = *piVar30 + 1;
      }
      if ((local_228->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar4] < INFINITY) {
        pdVar2 = (Avalue->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start + lVar26;
        piVar30 = piVar24;
        if (*pdVar2 <= 0.0 && *pdVar2 != 0.0) {
          piVar30 = piVar29;
        }
        *piVar30 = *piVar30 + 1;
      }
    }
  }
  local_1d8 = &this->rowintegral;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (local_1d8,(long)this->mipsolver->model_->num_row_);
  local_1e0 = &this->maxAbsRowCoef;
  std::vector<double,_std::allocator<double>_>::resize
            (local_1e0,(long)this->mipsolver->model_->num_row_);
  uVar21 = 0;
  local_1d0 = this;
  while (pHVar8 = this->mipsolver->model_, uVar21 != (uint)pHVar8->num_row_) {
    piVar7 = (this->ARstart_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar9 = (this->ARindex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_1c8 = uVar21 + 1;
    iVar19 = piVar7[uVar21 + 1];
    pdVar10 = (this->ARvalue_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_220 = this->epsilon;
    bVar18 = true;
    pcVar33 = (char *)0x0;
    local_1c0 = uVar21;
    for (lVar26 = (long)piVar7[uVar21]; uVar21 = local_1c0, this = local_1d0, iVar19 != lVar26;
        lVar26 = lVar26 + 1) {
      if ((bVar18) &&
         ((pHVar8->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
          _M_impl.super__Vector_impl_data._M_start[piVar9[lVar26]] != kContinuous)) {
        local_218 = pdVar10[lVar26];
        uStack_210 = 0;
        local_238 = pcVar33;
        dVar3 = round(local_218);
        bVar18 = ABS(local_218 - dVar3) <= local_220;
        pcVar33 = local_238;
      }
      else {
        bVar18 = false;
      }
      dVar3 = ABS(pdVar10[lVar26]);
      if (dVar3 <= (double)pcVar33) {
        dVar3 = (double)pcVar33;
      }
      pcVar33 = (char *)dVar3;
    }
    if (bVar18 != false) {
      pdVar10 = (local_1d0->presolvedModel).row_lower_.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
      dVar3 = pdVar10[local_1c0];
      local_238 = pcVar33;
      if (-INFINITY < dVar3) {
        dVar3 = ceil(dVar3 - local_1d0->feastol);
        pdVar10[uVar21] = dVar3;
      }
      pdVar10 = (this->presolvedModel).row_upper_.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
      dVar3 = pdVar10[uVar21];
      pcVar33 = local_238;
      if (dVar3 < INFINITY) {
        dVar3 = floor(dVar3 + this->feastol);
        pdVar10[uVar21] = dVar3;
        pcVar33 = local_238;
      }
    }
    (local_1d8->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar21] = bVar18;
    (local_1e0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
    ._M_start[uVar21] = (double)pcVar33;
    uVar21 = local_1c8;
  }
  globaldom = &this->domain;
  HighsObjectiveFunction::setupCliquePartition
            (&this->objectiveFunction,globaldom,&this->cliquetable);
  HighsDomain::setupObjectivePropagation(globaldom);
  HighsDomain::computeRowActivities(globaldom);
  HighsDomain::propagate(globaldom);
  if ((this->domain).infeasible_ == false) {
    if (local_228->num_col_ == 0) {
      this->mipsolver->modelstatus_ = kOptimal;
    }
    else {
      bVar18 = checkLimits(this,0);
      if (!bVar18) {
        pHVar11 = (this->domain).changedcols_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        for (pHVar27 = (this->domain).changedcols_.super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_start; pHVar27 != pHVar11;
            pHVar27 = pHVar27 + 1) {
          HighsImplications::cleanupVarbounds(&this->implications,*pHVar27);
        }
        HighsDomain::clearChangedCols(globaldom);
        std::__cxx11::string::string((string *)local_198,"presolve",&local_239);
        this_00 = &(this->lp).lpsolver;
        Highs::setOptionValue(this_00,(string *)local_198,&::kHighsOffString_abi_cxx11_);
        pvVar1 = local_1f8;
        std::__cxx11::string::~string((string *)local_198);
        std::__cxx11::string::string
                  ((string *)local_198,"simplex_initial_condition_check",&local_239);
        Highs::setOptionValue(this_00,(string *)local_198,false);
        std::__cxx11::string::~string((string *)local_198);
        checkObjIntegrality(this);
        pdVar10 = (this->rootlpsol).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((this->rootlpsol).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish != pdVar10) {
          (this->rootlpsol).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = pdVar10;
        }
        pdVar10 = (this->firstlpsol).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((this->firstlpsol).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish != pdVar10) {
          (this->firstlpsol).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = pdVar10;
        }
        this->maxTreeSizeLog2 = 0;
        iVar19 = 0;
        uVar28 = 0;
        while( true ) {
          local_198._0_4_ = iVar19;
          pHVar25 = this->mipsolver;
          if (iVar19 == pHVar25->model_->num_col_) break;
          switch((pHVar25->model_->integrality_).
                 super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar19]) {
          case kContinuous:
            dVar3 = (this->domain).col_lower_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[iVar19];
            pdVar2 = (this->domain).col_upper_.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start + iVar19;
            this_02 = pvVar1;
            if ((dVar3 != *pdVar2) || (NAN(dVar3) || NAN(*pdVar2))) {
LAB_002c2514:
              std::vector<int,_std::allocator<int>_>::push_back
                        (this_02,(value_type_conflict2 *)local_198);
            }
            break;
          case kInteger:
            dVar3 = (this->domain).col_lower_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[iVar19];
            pdVar2 = (this->domain).col_upper_.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start + iVar19;
            if ((dVar3 != *pdVar2) || (NAN(dVar3) || NAN(*pdVar2))) {
              std::vector<int,_std::allocator<int>_>::push_back
                        (local_1e8,(value_type_conflict2 *)local_198);
              std::vector<int,_std::allocator<int>_>::push_back
                        (local_200,(value_type_conflict2 *)local_198);
              pHVar8 = this->mipsolver->model_;
              dVar3 = ((pHVar8->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start[(int)local_198._0_4_] + 1.0) -
                      (pHVar8->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start[(int)local_198._0_4_];
              if (1024.0 <= dVar3) {
                dVar3 = 1024.0;
              }
              dVar3 = log2(dVar3);
              dVar3 = ceil(dVar3);
              this->maxTreeSizeLog2 = this->maxTreeSizeLog2 + (int)dVar3;
              pHVar8 = this->mipsolver->model_;
              uVar28 = uVar28 + ((pHVar8->col_lower_).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start[(int)local_198._0_4_] == 0.0 &&
                                (pHVar8->col_upper_).
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start[(int)local_198._0_4_] == 1.0);
            }
            else {
              uStack_230 = 0;
              local_238 = (char *)dVar3;
              dVar3 = round(dVar3);
              if (this->feastol <= ABS((double)local_238 - dVar3) &&
                  ABS((double)local_238 - dVar3) != this->feastol) {
                pHVar25->modelstatus_ = kInfeasible;
                uVar31 = SUB84(this->lower_bound,0);
                uVar32 = (undefined4)((ulong)this->lower_bound >> 0x20);
                this->lower_bound = INFINITY;
                if (pHVar25->submip != false) goto LAB_002c2340;
                goto LAB_002c2315;
              }
            }
            break;
          case kSemiContinuous:
          case kSemiInteger:
            highsLogUser(&(pHVar25->options_mip_->super_HighsOptionsStruct).log_options,kError,
                         "Semicontinuous or semiinteger variables should have been reformulated away before HighsMipSolverData::runSetup() is called."
                        );
            this_01 = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error(this_01,"Unexpected variable type");
            __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
          case kImplicitInteger:
            dVar3 = (this->domain).col_lower_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[iVar19];
            pdVar2 = (this->domain).col_upper_.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start + iVar19;
            if ((dVar3 != *pdVar2) || (NAN(dVar3) || NAN(*pdVar2))) {
              std::vector<int,_std::allocator<int>_>::push_back
                        (local_1f0,(value_type_conflict2 *)local_198);
              this_02 = local_200;
              goto LAB_002c2514;
            }
          }
          iVar19 = local_198._0_4_ + 1;
        }
        basisTransfer(this);
        iVar19 = (int)((ulong)((long)(this->integer_cols).
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)(this->integer_cols).
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 2);
        this->numintegercols = iVar19;
        this->detectSymmetries = (bool)(this->detectSymmetries & 0 < (int)uVar28);
        HVar5 = (this->cliquetable).numEntries;
        this->numCliqueEntriesAfterPresolve = HVar5;
        if (this->numRestarts == 0) {
          this->numCliqueEntriesAfterFirstPresolve = HVar5;
          local_238 = 
          "\nSolving MIP model with:\n   %d rows\n   %d cols (%d binary, %d integer, %d implied int., %d continuous)\n   %d nonzeros\n"
          ;
        }
        else {
          local_238 = 
          "Model after restart has %d rows, %d cols (%d bin., %d int., %d impl., %d cont.), and %d nonzeros\n"
          ;
        }
        pHVar25 = this->mipsolver;
        pHVar6 = pHVar25->options_mip_;
        local_218 = (double)CONCAT44(local_218._4_4_,pHVar25->model_->num_col_);
        local_220 = (double)CONCAT44(local_220._4_4_,pHVar25->model_->num_row_);
        piVar7 = (this->implint_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        piVar9 = (this->implint_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar12 = (this->continuous_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        piVar13 = (this->continuous_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar20 = HighsMipSolver::numNonzero(pHVar25);
        highsLogUser(&(pHVar6->super_HighsOptionsStruct).log_options,kInfo,local_238,
                     (ulong)local_220 & 0xffffffff,(ulong)local_218 & 0xffffffff,(ulong)uVar28,
                     (ulong)(iVar19 - uVar28),(ulong)((long)piVar7 - (long)piVar9) >> 2,
                     (ulong)((long)piVar12 - (long)piVar13) >> 2,(ulong)uVar20);
        HighsPrimalHeuristics::setupIntCols(&this->heuristics);
        if (INFINITY <= this->upper_limit) {
          this->analyticCenterComputed = false;
        }
        this->analyticCenterStatus = kMin;
        pdVar10 = (this->analyticCenter).super__Vector_base<double,_std::allocator<double>_>._M_impl
                  .super__Vector_impl_data._M_start;
        if ((this->analyticCenter).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish != pdVar10) {
          (this->analyticCenter).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = pdVar10;
        }
        HighsSymmetries::clear(&this->symmetries);
        if (this->numRestarts != 0) {
          highsLogUser(&(this->mipsolver->options_mip_->super_HighsOptionsStruct).log_options,kInfo,
                       "\n");
        }
      }
    }
  }
  else {
    pHVar25 = this->mipsolver;
    pHVar25->modelstatus_ = kInfeasible;
    uVar31 = SUB84(this->lower_bound,0);
    uVar32 = (undefined4)((ulong)this->lower_bound >> 0x20);
    this->lower_bound = INFINITY;
    if (pHVar25->submip == false) {
LAB_002c2315:
      if ((double)CONCAT44(uVar32,uVar31) < INFINITY) {
        updatePrimalDualIntegral
                  (this,(double)CONCAT44(uVar32,uVar31),INFINITY,this->upper_bound,this->upper_bound
                   ,false,false);
      }
    }
LAB_002c2340:
    (this->pruned_treeweight).hi = 1.0;
    (this->pruned_treeweight).lo = 0.0;
  }
  return;
}

Assistant:

void HighsMipSolverData::runSetup() {
  const HighsLp& model = *mipsolver.model_;

  last_disptime = -kHighsInf;
  disptime = 0;

  // Transform the reference of the objective limit and lower/upper
  // bounds from the original model to the current model, undoing the
  // transformation done before restart so that the offset change due
  // to presolve is incorporated. Bound changes are transitory, so no
  // real gap change, and no update to P-D integral is necessary
  upper_limit -= mipsolver.model_->offset_;
  optimality_limit -= mipsolver.model_->offset_;

  lower_bound -= mipsolver.model_->offset_;
  upper_bound -= mipsolver.model_->offset_;

  if (mipsolver.solution_objective_ != kHighsInf) {
    incumbent = postSolveStack.getReducedPrimalSolution(mipsolver.solution_);
    // return the objective value in the transformed space
    double solobj =
        mipsolver.solution_objective_ * (int)mipsolver.orig_model_->sense_ -
        mipsolver.model_->offset_;
    bool feasible = mipsolver.bound_violation_ <=
                        mipsolver.options_mip_->mip_feasibility_tolerance &&
                    mipsolver.integrality_violation_ <=
                        mipsolver.options_mip_->mip_feasibility_tolerance &&
                    mipsolver.row_violation_ <=
                        mipsolver.options_mip_->mip_feasibility_tolerance;
    if (numRestarts == 0) {
      highsLogUser(mipsolver.options_mip_->log_options, HighsLogType::kInfo,
                   "\nMIP start solution is %s, objective value is %.12g\n",
                   feasible ? "feasible" : "infeasible",
                   mipsolver.solution_objective_);
    }
    if (feasible && solobj < upper_bound) {
      double prev_upper_bound = upper_bound;

      upper_bound = solobj;

      bool bound_change = upper_bound != prev_upper_bound;
      if (!mipsolver.submip && bound_change)
        updatePrimalDualIntegral(lower_bound, lower_bound, prev_upper_bound,
                                 upper_bound);

      double new_upper_limit = computeNewUpperLimit(solobj, 0.0, 0.0);
      saveReportMipSolution(new_upper_limit);
      if (new_upper_limit < upper_limit) {
        upper_limit = new_upper_limit;
        optimality_limit =
            computeNewUpperLimit(solobj, mipsolver.options_mip_->mip_abs_gap,
                                 mipsolver.options_mip_->mip_rel_gap);
        nodequeue.setOptimalityLimit(optimality_limit);
      }
    }
    if (!mipsolver.submip && feasible && mipsolver.callback_->user_callback &&
        mipsolver.callback_->active[kCallbackMipSolution]) {
      assert(!mipsolver.submip);
      mipsolver.callback_->clearHighsCallbackDataOut();
      mipsolver.callback_->data_out.mip_solution = mipsolver.solution_.data();
      const bool interrupt = interruptFromCallbackWithData(
          kCallbackMipSolution, mipsolver.solution_objective_,
          "Feasible solution");
      assert(!interrupt);
    }
  }

  if (mipsolver.numCol() == 0)
    addIncumbent(std::vector<double>(), 0, kSolutionSourceEmptyMip);

  redcostfixing = HighsRedcostFixing();
  pseudocost = HighsPseudocost(mipsolver);
  nodequeue.setNumCol(mipsolver.numCol());
  nodequeue.setOptimalityLimit(optimality_limit);

  continuous_cols.clear();
  integer_cols.clear();
  implint_cols.clear();
  integral_cols.clear();

  rowMatrixSet = false;
  if (!rowMatrixSet) {
    rowMatrixSet = true;
    highsSparseTranspose(model.num_row_, model.num_col_, model.a_matrix_.start_,
                         model.a_matrix_.index_, model.a_matrix_.value_,
                         ARstart_, ARindex_, ARvalue_);
    // (re-)initialize number of uplocks and downlocks
    uplocks.assign(model.num_col_, 0);
    downlocks.assign(model.num_col_, 0);
    for (HighsInt i = 0; i != model.num_col_; ++i) {
      HighsInt start = model.a_matrix_.start_[i];
      HighsInt end = model.a_matrix_.start_[i + 1];
      for (HighsInt j = start; j != end; ++j) {
        HighsInt row = model.a_matrix_.index_[j];

        if (model.row_lower_[row] != -kHighsInf) {
          if (model.a_matrix_.value_[j] < 0)
            ++uplocks[i];
          else
            ++downlocks[i];
        }
        if (model.row_upper_[row] != kHighsInf) {
          if (model.a_matrix_.value_[j] < 0)
            ++downlocks[i];
          else
            ++uplocks[i];
        }
      }
    }
  }

  rowintegral.resize(mipsolver.model_->num_row_);

  // compute the maximal absolute coefficients to filter propagation
  maxAbsRowCoef.resize(mipsolver.model_->num_row_);
  for (HighsInt i = 0; i != mipsolver.model_->num_row_; ++i) {
    double maxabsval = 0.0;

    HighsInt start = ARstart_[i];
    HighsInt end = ARstart_[i + 1];
    bool integral = true;
    for (HighsInt j = start; j != end; ++j) {
      integral =
          integral &&
          mipsolver.variableType(ARindex_[j]) != HighsVarType::kContinuous &&
          fractionality(ARvalue_[j]) <= epsilon;

      maxabsval = std::max(maxabsval, std::abs(ARvalue_[j]));
    }

    if (integral) {
      if (presolvedModel.row_lower_[i] != -kHighsInf)
        presolvedModel.row_lower_[i] =
            std::ceil(presolvedModel.row_lower_[i] - feastol);

      if (presolvedModel.row_upper_[i] != kHighsInf)
        presolvedModel.row_upper_[i] =
            std::floor(presolvedModel.row_upper_[i] + feastol);
    }

    rowintegral[i] = integral;
    maxAbsRowCoef[i] = maxabsval;
  }

  // compute row activities and propagate all rows once
  objectiveFunction.setupCliquePartition(domain, cliquetable);
  domain.setupObjectivePropagation();
  domain.computeRowActivities();
  domain.propagate();
  if (domain.infeasible()) {
    mipsolver.modelstatus_ = HighsModelStatus::kInfeasible;

    double prev_lower_bound = lower_bound;

    lower_bound = kHighsInf;

    bool bound_change = lower_bound != prev_lower_bound;
    if (!mipsolver.submip && bound_change)
      updatePrimalDualIntegral(prev_lower_bound, lower_bound, upper_bound,
                               upper_bound);

    pruned_treeweight = 1.0;
    return;
  }

  if (model.num_col_ == 0) {
    mipsolver.modelstatus_ = HighsModelStatus::kOptimal;
    return;
  }

  if (checkLimits()) return;
  // extract cliques if they have not been extracted before

  for (HighsInt col : domain.getChangedCols())
    implications.cleanupVarbounds(col);
  domain.clearChangedCols();

  lp.getLpSolver().setOptionValue("presolve", kHighsOffString);
  // lp.getLpSolver().setOptionValue("dual_simplex_cost_perturbation_multiplier",
  // 0.0); lp.getLpSolver().setOptionValue("parallel", kHighsOnString);
  lp.getLpSolver().setOptionValue("simplex_initial_condition_check", false);

  checkObjIntegrality();
  rootlpsol.clear();
  firstlpsol.clear();
  HighsInt numBin = 0;

  maxTreeSizeLog2 = 0;
  for (HighsInt i = 0; i != mipsolver.numCol(); ++i) {
    switch (mipsolver.variableType(i)) {
      case HighsVarType::kContinuous:
        if (domain.isFixed(i)) continue;
        continuous_cols.push_back(i);
        break;
      case HighsVarType::kImplicitInteger:
        if (domain.isFixed(i)) continue;
        implint_cols.push_back(i);
        integral_cols.push_back(i);
        break;
      case HighsVarType::kInteger:
        if (domain.isFixed(i)) {
          if (fractionality(domain.col_lower_[i]) > feastol) {
            // integer variable is fixed to a fractional value -> infeasible
            mipsolver.modelstatus_ = HighsModelStatus::kInfeasible;

            double prev_lower_bound = lower_bound;

            lower_bound = kHighsInf;

            bool bound_change = lower_bound != prev_lower_bound;
            if (!mipsolver.submip && bound_change)
              updatePrimalDualIntegral(prev_lower_bound, lower_bound,
                                       upper_bound, upper_bound);

            pruned_treeweight = 1.0;
            return;
          }
          continue;
        }
        integer_cols.push_back(i);
        integral_cols.push_back(i);
        maxTreeSizeLog2 += (HighsInt)std::ceil(
            std::log2(std::min(1024.0, 1.0 + mipsolver.model_->col_upper_[i] -
                                           mipsolver.model_->col_lower_[i])));
        // NB Since this is for counting the number of times the
        // condition is true using the bitwise operator avoids having
        // any conditional branch whereas using the logical operator
        // would require a branch due to short circuit
        // evaluation. Semantically both is equivalent and correct. If
        // there was any code to be executed for the condition being
        // true then there would be a conditional branch in any case
        // and I would have used the logical to begin with.
        //
        // Hence any compiler warning can be ignored safely
        numBin +=
            (static_cast<HighsInt>(mipsolver.model_->col_lower_[i] == 0.0) &
             static_cast<HighsInt>(mipsolver.model_->col_upper_[i] == 1.0));
        break;
      case HighsVarType::kSemiContinuous:
      case HighsVarType::kSemiInteger:
        highsLogUser(mipsolver.options_mip_->log_options, HighsLogType::kError,
                     "Semicontinuous or semiinteger variables should have been "
                     "reformulated away before HighsMipSolverData::runSetup() "
                     "is called.");
        throw std::logic_error("Unexpected variable type");
    }
  }

  basisTransfer();

  numintegercols = integer_cols.size();
  detectSymmetries = detectSymmetries && numBin > 0;
  numCliqueEntriesAfterPresolve = cliquetable.getNumEntries();

  if (numRestarts == 0) {
    numCliqueEntriesAfterFirstPresolve = cliquetable.getNumEntries();
    highsLogUser(mipsolver.options_mip_->log_options, HighsLogType::kInfo,
                 // clang-format off
               "\nSolving MIP model with:\n"
               "   %" HIGHSINT_FORMAT " rows\n"
               "   %" HIGHSINT_FORMAT " cols (%" HIGHSINT_FORMAT" binary, %" HIGHSINT_FORMAT " integer, %" HIGHSINT_FORMAT" implied int., %" HIGHSINT_FORMAT " continuous)\n"
               "   %" HIGHSINT_FORMAT " nonzeros\n",
                 // clang-format on
                 mipsolver.numRow(), mipsolver.numCol(), numBin,
                 numintegercols - numBin, (HighsInt)implint_cols.size(),
                 (HighsInt)continuous_cols.size(), mipsolver.numNonzero());
  } else {
    highsLogUser(mipsolver.options_mip_->log_options, HighsLogType::kInfo,
                 "Model after restart has %" HIGHSINT_FORMAT
                 " rows, %" HIGHSINT_FORMAT " cols (%" HIGHSINT_FORMAT
                 " bin., %" HIGHSINT_FORMAT " int., %" HIGHSINT_FORMAT
                 " impl., %" HIGHSINT_FORMAT " cont.), and %" HIGHSINT_FORMAT
                 " nonzeros\n",
                 mipsolver.numRow(), mipsolver.numCol(), numBin,
                 numintegercols - numBin, (HighsInt)implint_cols.size(),
                 (HighsInt)continuous_cols.size(), mipsolver.numNonzero());
  }

  heuristics.setupIntCols();

#ifdef HIGHS_DEBUGSOL
  if (numRestarts == 0) {
    debugSolution.activate();
    assert(!debugSolution.debugSolActive ||
           checkSolution(debugSolution.debugSolution));
  }
#endif

  if (upper_limit == kHighsInf) analyticCenterComputed = false;
  analyticCenterStatus = HighsModelStatus::kNotset;
  analyticCenter.clear();

  symmetries.clear();

  if (numRestarts != 0)
    highsLogUser(mipsolver.options_mip_->log_options, HighsLogType::kInfo,
                 "\n");
}